

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkCollectHie(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *vModels;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                  ,0x1f9,"Vec_Ptr_t *Abc_NtkCollectHie(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] == 0) {
    vModels = (Vec_Ptr_t *)malloc(0x10);
    vModels->nCap = 1000;
    vModels->nSize = 0;
    ppvVar2 = (void **)malloc(8000);
    vModels->pArray = ppvVar2;
    if (pNtk->pDesign == (Abc_Des_t *)0x0) {
      vModels->nSize = 1;
      *vModels->pArray = pNtk;
    }
    else {
      pVVar1 = pNtk->pDesign->vModules;
      lVar3 = (long)pVVar1->nSize;
      if (0 < lVar3) {
        ppvVar2 = pVVar1->pArray;
        lVar4 = 0;
        do {
          *(undefined4 *)((long)ppvVar2[lVar4] + 0xa8) = 0xffffffff;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      Abc_NtkCollectHie_rec(pNtk,vModels);
    }
    return vModels;
  }
  __assert_fail("!Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieCec.c"
                ,0x1fa,"Vec_Ptr_t *Abc_NtkCollectHie(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectHie( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vResult;
    Abc_Ntk_t * pModel;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );

    vResult = Vec_PtrAlloc( 1000 );
    if ( pNtk->pDesign == NULL )
    {
        Vec_PtrPush( vResult, pNtk );
        return vResult;
    }

    vMods = pNtk->pDesign->vModules;
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
        pModel->iStep = -1;

    Abc_NtkCollectHie_rec( pNtk, vResult );
    return vResult;    
}